

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O1

Code * __thiscall r_exec::PGMOverlay::get_mk_rdx(PGMOverlay *this,uint16_t *extent_index)

{
  int iVar1;
  Code *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar2;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ulong uVar3;
  ulong uVar4;
  Atom local_34 [4];
  
  *extent_index = 5;
  this_00 = (Code *)operator_new(0x150);
  r_code::Mem::Get();
  r_code::Code::Code(this_00);
  this_00[1].markers.cells.
  super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00[1].markers.used_cells_head = 0;
  this_00[1].markers.cells.
  super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this_00[1].markers.cells.
  super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00[1].super__Object.refCount.super___atomic_base<long>._M_i = 0;
  this_00[1].storage_index = 0;
  this_00[1].markers.used_cells_tail = 0;
  this_00[1].markers.free_cells = 0;
  this_00[1].markers.used_cell_count = 0;
  this_00[1].markers.free_cell_count = 0;
  this_00[1].views._M_h._M_buckets = (__buckets_ptr)0x0;
  this_00[1].views._M_h._M_bucket_count = 0;
  this_00[1].views._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  this_00[1].views._M_h._M_element_count = 0;
  *(undefined8 *)&this_00[1].views._M_h._M_rehash_policy = 0;
  this_00[1].views._M_h._M_rehash_policy._M_next_resize = 0;
  this_00[1].views._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00[2].super__Object._vptr__Object = (_func_int **)0x0;
  this_00[2].super__Object.refCount.super___atomic_base<long>._M_i = 0;
  this_00[2].storage_index = 0;
  this_00[2].markers.cells.
  super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this_00[2].markers.cells.
  super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00[2].markers.cells.
  super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00[1].super__Object._vptr__Object = (_func_int **)0xffffffff;
  (this_00->super__Object)._vptr__Object = (_func_int **)&PTR__Object_001bf6e8;
  r_code::Atom::Marker((ushort)local_34,(uchar)Opcodes::MkRdx);
  iVar1 = (*(this_00->super__Object)._vptr__Object[4])(this_00,0);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),local_34);
  r_code::Atom::~Atom(local_34);
  r_code::Atom::RPointer((ushort)local_34);
  iVar1 = (*(this_00->super__Object)._vptr__Object[4])(this_00,1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar1),local_34);
  r_code::Atom::~Atom(local_34);
  (*(this_00->super__Object)._vptr__Object[0x19])
            (this_00,(((this->super_InputLessPGMOverlay).super_Overlay.controller)->view->object).
                     object);
  r_code::Atom::IPointer((ushort)local_34);
  iVar1 = (*(this_00->super__Object)._vptr__Object[4])(this_00,2);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar1),local_34);
  r_code::Atom::~Atom(local_34);
  r_code::Atom::Set((uchar)local_34);
  *extent_index = *extent_index + 1;
  iVar1 = (*(this_00->super__Object)._vptr__Object[4])(this_00);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar1),local_34);
  r_code::Atom::~Atom(local_34);
  if ((this->input_views).
      super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->input_views).
      super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar2 = 1;
    uVar3 = 0;
    do {
      uVar4 = uVar2 & 0xffff;
      r_code::Atom::RPointer((ushort)local_34);
      *extent_index = *extent_index + 1;
      iVar1 = (*(this_00->super__Object)._vptr__Object[4])(this_00);
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar1),local_34);
      r_code::Atom::~Atom(local_34);
      (*(this_00->super__Object)._vptr__Object[0x19])
                (this_00,(this->input_views).
                         super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar3].object[2]._vptr__Object);
      uVar2 = (ulong)((int)uVar4 + 1);
      uVar3 = uVar4;
    } while (uVar4 < (ulong)((long)(this->input_views).
                                   super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->input_views).
                                   super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  r_code::Atom::IPointer((ushort)local_34);
  iVar1 = (*(this_00->super__Object)._vptr__Object[4])(this_00,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar1),local_34);
  r_code::Atom::~Atom(local_34);
  r_code::Atom::Float(1.0);
  iVar1 = (*(this_00->super__Object)._vptr__Object[4])(this_00,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar1),local_34);
  r_code::Atom::~Atom(local_34);
  return this_00;
}

Assistant:

Code *PGMOverlay::get_mk_rdx(uint16_t &extent_index) const
{
    uint16_t write_index = 0;
    extent_index = MK_RDX_ARITY + 1;
    Code *mk_rdx = new r_exec::LObject(_Mem::Get());
    mk_rdx->code(write_index++) = Atom::Marker(Opcodes::MkRdx, MK_RDX_ARITY);
    mk_rdx->code(write_index++) = Atom::RPointer(0); // code.
    mk_rdx->add_reference(getObject());
    mk_rdx->code(write_index++) = Atom::IPointer(extent_index); // inputs.
    mk_rdx->code(extent_index++) = Atom::Set(input_views.size());

    for (uint16_t i = 0; i < input_views.size(); ++i) {
        mk_rdx->code(extent_index++) = Atom::RPointer(i + 1);
        mk_rdx->add_reference(input_views[i]->object);
    }

    mk_rdx->code(write_index++) = Atom::IPointer(extent_index); // productions.
    mk_rdx->code(write_index++) = Atom::Float(1); // psln_thr.
    return mk_rdx;
}